

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O0

void __thiscall
poplar::
map<poplar::plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_fkhash_nlm<int,_16UL>_>
::show_stats(map<poplar::plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_fkhash_nlm<int,_16UL>_>
             *this,ostream *os,int n)

{
  ostream *os_00;
  ostream *os_01;
  string *in_RSI;
  map<poplar::plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_fkhash_nlm<int,_16UL>_>
  *in_RDI;
  int unaff_retaddr;
  ostream *in_stack_00000008;
  undefined4 in_stack_00000010;
  int in_stack_00000014;
  ostream *in_stack_00000018;
  plain_fkhash_trie<90U,_poplar::hash::vigna_hasher> *in_stack_00000020;
  string indent;
  char (*in_stack_ffffffffffffff78) [4];
  map<poplar::plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_fkhash_nlm<int,_16UL>_>
  *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  string *indent_00;
  ostream *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffffa8;
  string local_38 [40];
  string *local_10;
  
  local_10 = in_RSI;
  get_indent_abi_cxx11_((int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  show_stat<char[4]>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                     &in_stack_ffffffffffffff80->is_ready_,in_stack_ffffffffffffff78);
  show_stat<unsigned_long>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
             &in_stack_ffffffffffffff80->is_ready_,(unsigned_long *)in_stack_ffffffffffffff78);
  indent_00 = local_10;
  os_00 = (ostream *)size(in_RDI);
  show_stat<unsigned_long>
            (os_00,indent_00,&in_stack_ffffffffffffff80->is_ready_,
             (unsigned_long *)in_stack_ffffffffffffff78);
  os_01 = (ostream *)alloc_bytes(in_stack_ffffffffffffff80);
  show_stat<unsigned_long>(os_00,indent_00,(char *)os_01,(unsigned_long *)local_10);
  show_member(os_01,local_10,(char *)0x2203c0);
  plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>::show_stats
            (in_stack_00000020,in_stack_00000018,in_stack_00000014);
  show_member(os_01,local_10,(char *)0x2203f3);
  compact_fkhash_nlm<int,_16UL>::show_stats
            ((compact_fkhash_nlm<int,_16UL> *)CONCAT44(in_stack_00000014,in_stack_00000010),
             in_stack_00000008,unaff_retaddr);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void show_stats(std::ostream& os, int n = 0) const {
        auto indent = get_indent(n);
        show_stat(os, indent, "name", "map");
        show_stat(os, indent, "lambda", lambda_);
        show_stat(os, indent, "size", size());
        show_stat(os, indent, "alloc_bytes", alloc_bytes());
#ifdef POPLAR_EXTRA_STATS
        show_stat(os, indent, "rate_steps", rate_steps());
#endif
        show_member(os, indent, "hash_trie_");
        hash_trie_.show_stats(os, n + 1);
        show_member(os, indent, "label_store_");
        label_store_.show_stats(os, n + 1);
    }